

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.h
# Opt level: O0

void __thiscall cmGlobalNinjaGenerator::~cmGlobalNinjaGenerator(cmGlobalNinjaGenerator *this)

{
  cmGlobalNinjaGenerator *this_local;
  
  ~cmGlobalNinjaGenerator(this);
  operator_delete(this,0x788);
  return;
}

Assistant:

virtual ~cmGlobalNinjaGenerator() { }